

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Addition_Test.cpp
# Opt level: O0

void __thiscall AdditionTest_twoValues_Test::TestBody(AdditionTest_twoValues_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_80;
  Message local_78;
  int local_70 [2];
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50 [3];
  int local_38 [2];
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  Addition addition;
  int y;
  int x;
  AdditionTest_twoValues_Test *this_local;
  
  local_38[1] = 9;
  local_38[0] = projectone::Addition::twoValues(4,5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_30,"9","addition.twoValues(x,y)",local_38 + 1,local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/test/Addition_Test.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_70[1] = 5;
  local_70[0] = projectone::Addition::twoValues(2,3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_68,"5","addition.twoValues(2,3)",local_70 + 1,local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/test/Addition_Test.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST_F(AdditionTest, twoValues){
    const int x = 4;
    const int y = 5;
    projectone::Addition addition;
    EXPECT_EQ(9,addition.twoValues(x,y));
    EXPECT_EQ(5,addition.twoValues(2,3));
}